

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void prf_messages_del_handler
               (int type,int level,_func_void_int_int_char_ptr_void_ptr *func,void *data)

{
  int iVar1;
  void *in_RCX;
  _func_void_int_int_char_ptr_void_ptr *in_RDX;
  int in_ESI;
  int in_EDI;
  int count;
  int i;
  int local_1c;
  
  iVar1 = prf_array_count((void *)0x116a4b);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    if ((((prf_handlers[in_EDI][local_1c] != (prf_msg_handler_t *)0x0) &&
         (prf_handlers[in_EDI][local_1c]->func == in_RDX)) &&
        (prf_handlers[in_EDI][local_1c]->userdata == in_RCX)) &&
       (prf_handlers[in_EDI][local_1c]->level == in_ESI)) {
      free(prf_handlers[in_EDI][local_1c]);
      prf_handlers[in_EDI][local_1c] = (prf_msg_handler_t *)0x0;
    }
  }
  return;
}

Assistant:

void
prf_messages_del_handler(
    int type,
    int level,
    void (*func)( int, int, const char *, void * ),
    void * data )
{
    int i, count;
    assert( type > 0 && type < 6 );
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( (prf_handlers[type][i] != NULL) &&
             (prf_handlers[type][i]->func == func) &&
             (prf_handlers[type][i]->userdata == data) &&
             (prf_handlers[type][i]->level == level) ) {
            free( prf_handlers[type][i] );
            prf_handlers[type][i] = NULL;
        }
    }
    
}